

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindAssignmentPattern
          (Compilation *comp,AssignmentPatternExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SyntaxKind SVar1;
  SourceRange sourceRange;
  bool bVar2;
  Diagnostic *pDVar3;
  Expression *pEVar4;
  PackedStructType *pPVar5;
  UnpackedStructType *pUVar6;
  SimpleAssignmentPatternSyntax *pSVar7;
  StructuredAssignmentPatternSyntax *pSVar8;
  ReplicatedAssignmentPatternSyntax *pRVar9;
  logic_error *plVar10;
  Compilation *comp_00;
  SourceLocation in_stack_fffffffffffffa58;
  Type *local_4f8;
  Type *local_4e8;
  Type *local_4d8;
  string local_4c0;
  allocator<char> local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  SourceLocation local_3f8;
  SourceLocation local_3f0;
  SourceLocation local_3e8;
  SourceLocation local_3e0;
  SourceLocation local_3d8;
  SourceLocation local_3d0;
  undefined1 local_3c1;
  string local_3c0;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  SourceLocation local_2f8;
  SourceLocation local_2f0;
  SourceLocation local_2e8;
  SourceLocation local_2e0;
  undefined4 local_2d6;
  undefined1 local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  SourceLocation local_208;
  SourceLocation local_200;
  SourceLocation local_1f8;
  SourceLocation local_1f0;
  SourceLocation local_1e8;
  SourceLocation local_1e0;
  undefined1 local_1d1;
  string local_1d0;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  SourceLocation local_f8;
  SourceLocation local_f0;
  SourceLocation local_e8;
  SourceLocation local_e0;
  SourceLocation local_d8;
  SourceLocation local_d0;
  SyntaxNode *local_c8;
  AssignmentPatternSyntax *p;
  SourceLocation local_b8;
  undefined4 local_ac;
  FixedSizeUnpackedArrayType *local_a8;
  FixedSizeUnpackedArrayType *ua_1;
  PackedArrayType *ua;
  Type *ct;
  Type *pTStack_88;
  bitwidth_t numElements;
  Type *elementType;
  Scope *structScope;
  Type *type;
  DiagCode local_5c;
  SourceLocation local_58;
  SourceLocation local_50;
  undefined4 local_44;
  undefined1 local_40 [8];
  SourceRange range;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  AssignmentPatternExpressionSyntax *syntax_local;
  Compilation *comp_local;
  
  range.endLoc = (SourceLocation)assignmentTarget;
  _local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  if (syntax->type != (DataTypeSyntax *)0x0) {
    range.endLoc = (SourceLocation)Compilation::getType(comp,syntax->type,context,(Type *)0x0);
    bVar2 = Type::isSimpleType((Type *)range.endLoc);
    if ((!bVar2) && ((syntax->type->super_ExpressionSyntax).super_SyntaxNode.kind != TypeReference))
    {
      bVar2 = Type::isError((Type *)range.endLoc);
      if (!bVar2) {
        local_44 = 0x1c0007;
        local_58 = (SourceLocation)local_40;
        local_50 = range.startLoc;
        pDVar3 = ASTContext::addDiag(context,(DiagCode)0x1c0007,_local_40);
        ast::operator<<(pDVar3,(Type *)range.endLoc);
      }
      pEVar4 = badExpr(comp,(Expression *)0x0);
      return pEVar4;
    }
  }
  if ((range.endLoc == (SourceLocation)0x0) || (bVar2 = Type::isError((Type *)range.endLoc), bVar2))
  {
    if (range.endLoc == (SourceLocation)0x0) {
      local_5c.subsystem = Expressions;
      local_5c.code = 0x14;
      _type = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,local_5c,_type);
    }
    comp_local = (Compilation *)badExpr(comp,(Expression *)0x0);
  }
  else {
    structScope = (Scope *)range.endLoc;
    elementType = (Type *)0x0;
    pTStack_88 = (Type *)0x0;
    ct._4_4_ = 0;
    ua = (PackedArrayType *)Type::getCanonicalType((Type *)range.endLoc);
    if ((ua->super_IntegralType).super_Type.super_Symbol.kind == PackedStructType) {
      pPVar5 = Symbol::as<slang::ast::PackedStructType>((Symbol *)ua);
      local_4d8 = (Type *)0x0;
      if (pPVar5 != (PackedStructType *)0x0) {
        local_4d8 = (Type *)&pPVar5->super_Scope;
      }
      elementType = local_4d8;
    }
    else if ((ua->super_IntegralType).super_Type.super_Symbol.kind == UnpackedStructType) {
      pUVar6 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)ua);
      local_4e8 = (Type *)0x0;
      if (pUVar6 != (UnpackedStructType *)0x0) {
        local_4e8 = (Type *)&pUVar6->super_Scope;
      }
      elementType = local_4e8;
    }
    else if ((ua->super_IntegralType).super_Type.super_Symbol.kind == PackedArrayType) {
      ua_1 = (FixedSizeUnpackedArrayType *)Symbol::as<slang::ast::PackedArrayType>((Symbol *)ua);
      pTStack_88 = ((PackedArrayType *)ua_1)->elementType;
      ct._4_4_ = ConstantRange::width(&((PackedArrayType *)ua_1)->range);
    }
    else if ((ua->super_IntegralType).super_Type.super_Symbol.kind == FixedSizeUnpackedArrayType) {
      local_a8 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)ua);
      pTStack_88 = local_a8->elementType;
      ct._4_4_ = ConstantRange::width(&local_a8->range);
    }
    else if ((((ua->super_IntegralType).super_Type.super_Symbol.kind == DynamicArrayType) ||
             ((ua->super_IntegralType).super_Type.super_Symbol.kind == AssociativeArrayType)) ||
            ((ua->super_IntegralType).super_Type.super_Symbol.kind == QueueType)) {
      pTStack_88 = Type::getArrayElementType((Type *)ua);
    }
    else {
      bVar2 = Type::isIntegral((Type *)ua);
      if ((!bVar2) || ((ua->super_IntegralType).super_Type.super_Symbol.kind == ScalarType)) {
        local_ac = 0x1c0007;
        p = (AssignmentPatternSyntax *)local_40;
        local_b8 = range.startLoc;
        pDVar3 = ASTContext::addDiag(context,(DiagCode)0x1c0007,_local_40);
        ast::operator<<(pDVar3,(Type *)structScope);
        pEVar4 = badExpr(comp,(Expression *)0x0);
        return pEVar4;
      }
      bVar2 = Type::isFourState((Type *)ua);
      if (bVar2) {
        local_4f8 = Compilation::getLogicType(comp);
      }
      else {
        local_4f8 = Compilation::getBitType(comp);
      }
      pTStack_88 = local_4f8;
      ct._4_4_ = Type::getBitWidth((Type *)ua);
    }
    local_c8 = &not_null<slang::syntax::AssignmentPatternSyntax_*>::operator*(&syntax->pattern)->
                super_SyntaxNode;
    if (elementType == (Type *)0x0) {
      if (((ua->super_IntegralType).super_Type.super_Symbol.kind == DynamicArrayType) ||
         ((ua->super_IntegralType).super_Type.super_Symbol.kind == QueueType)) {
        SVar1 = local_c8->kind;
        if (SVar1 == ReplicatedAssignmentPattern) {
          pRVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                             (local_c8);
          local_208 = (SourceLocation)local_40;
          local_200 = range.startLoc;
          comp_local = (Compilation *)
                       ReplicatedAssignmentPatternExpression::forDynamicArray
                                 (comp,pRVar9,context,(Type *)structScope,pTStack_88,_local_40);
        }
        else if (SVar1 == SimpleAssignmentPattern) {
          pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                             (local_c8);
          local_1e8 = (SourceLocation)local_40;
          local_1e0 = range.startLoc;
          comp_local = (Compilation *)
                       SimpleAssignmentPatternExpression::forDynamicArray
                                 (comp,pSVar7,context,(Type *)structScope,pTStack_88,_local_40);
        }
        else {
          if (SVar1 != StructuredAssignmentPattern) {
            local_2d1 = 1;
            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,&local_2a9);
            std::operator+(&local_288,&local_2a8,":");
            std::__cxx11::to_string(&local_2d0,0x46b);
            std::operator+(&local_268,&local_288,&local_2d0);
            std::operator+(&local_248,&local_268,": ");
            std::operator+(&local_228,&local_248,"Default case should be unreachable!");
            std::logic_error::logic_error(plVar10,(string *)&local_228);
            local_2d1 = 0;
            __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                             (local_c8);
          local_1f8 = (SourceLocation)local_40;
          local_1f0 = range.startLoc;
          comp_local = (Compilation *)
                       StructuredAssignmentPatternExpression::forDynamicArray
                                 (comp,pSVar8,context,(Type *)structScope,pTStack_88,_local_40);
        }
      }
      else if ((ua->super_IntegralType).super_Type.super_Symbol.kind == AssociativeArrayType) {
        SVar1 = local_c8->kind;
        if ((SVar1 == ReplicatedAssignmentPattern) || (SVar1 == SimpleAssignmentPattern)) {
          local_2d6 = 0xc0007;
          local_2e8 = (SourceLocation)local_40;
          local_2e0 = range.startLoc;
          ASTContext::addDiag(context,(DiagCode)0xc0007,_local_40);
          comp_local = (Compilation *)badExpr(comp,(Expression *)0x0);
        }
        else {
          if (SVar1 != StructuredAssignmentPattern) {
            local_3c1 = 1;
            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_398,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,&local_399);
            std::operator+(&local_378,&local_398,":");
            std::__cxx11::to_string(&local_3c0,0x479);
            std::operator+(&local_358,&local_378,&local_3c0);
            std::operator+(&local_338,&local_358,": ");
            std::operator+(&local_318,&local_338,"Default case should be unreachable!");
            std::logic_error::logic_error(plVar10,(string *)&local_318);
            local_3c1 = 0;
            __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                             (local_c8);
          local_2f8 = (SourceLocation)local_40;
          local_2f0 = range.startLoc;
          comp_local = (Compilation *)
                       StructuredAssignmentPatternExpression::forAssociativeArray
                                 (comp,pSVar8,context,(Type *)structScope,pTStack_88,_local_40);
        }
      }
      else {
        SVar1 = local_c8->kind;
        if (SVar1 == ReplicatedAssignmentPattern) {
          pRVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                             (local_c8);
          local_3f8 = (SourceLocation)local_40;
          local_3f0 = range.startLoc;
          comp_local = (Compilation *)
                       ReplicatedAssignmentPatternExpression::forFixedArray
                                 (comp,pRVar9,context,(Type *)structScope,pTStack_88,ct._4_4_,
                                  _local_40);
        }
        else if (SVar1 == SimpleAssignmentPattern) {
          comp_00 = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                              (local_c8);
          local_3d8 = (SourceLocation)local_40;
          local_3d0 = range.startLoc;
          sourceRange.endLoc = in_stack_fffffffffffffa58;
          sourceRange.startLoc = range.startLoc;
          comp_local = (Compilation *)
                       SimpleAssignmentPatternExpression::forFixedArray
                                 ((SimpleAssignmentPatternExpression *)comp,comp_00,
                                  (SimpleAssignmentPatternSyntax *)context,(ASTContext *)structScope
                                  ,pTStack_88,(Type *)(ulong)ct._4_4_,local_40._0_4_,sourceRange);
        }
        else {
          if (SVar1 != StructuredAssignmentPattern) {
            plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_498,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,&local_499);
            std::operator+(&local_478,&local_498,":");
            std::__cxx11::to_string(&local_4c0,0x48b);
            std::operator+(&local_458,&local_478,&local_4c0);
            std::operator+(&local_438,&local_458,": ");
            std::operator+(&local_418,&local_438,"Default case should be unreachable!");
            std::logic_error::logic_error(plVar10,(string *)&local_418);
            __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                             (local_c8);
          local_3e8 = (SourceLocation)local_40;
          local_3e0 = range.startLoc;
          comp_local = (Compilation *)
                       StructuredAssignmentPatternExpression::forFixedArray
                                 (comp,pSVar8,context,(Type *)structScope,pTStack_88,_local_40);
        }
      }
    }
    else {
      SVar1 = local_c8->kind;
      if (SVar1 == ReplicatedAssignmentPattern) {
        pRVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                           (local_c8);
        local_f8 = (SourceLocation)local_40;
        local_f0 = range.startLoc;
        comp_local = (Compilation *)
                     ReplicatedAssignmentPatternExpression::forStruct
                               (comp,pRVar9,context,(Type *)structScope,(Scope *)elementType,
                                _local_40);
      }
      else if (SVar1 == SimpleAssignmentPattern) {
        pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                           (local_c8);
        local_d8 = (SourceLocation)local_40;
        local_d0 = range.startLoc;
        comp_local = (Compilation *)
                     SimpleAssignmentPatternExpression::forStruct
                               (comp,pSVar7,context,(Type *)structScope,(Scope *)elementType,
                                _local_40);
      }
      else {
        if (SVar1 != StructuredAssignmentPattern) {
          local_1d1 = 1;
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                     ,&local_199);
          std::operator+(&local_178,&local_198,":");
          std::__cxx11::to_string(&local_1d0,0x459);
          std::operator+(&local_158,&local_178,&local_1d0);
          std::operator+(&local_138,&local_158,": ");
          std::operator+(&local_118,&local_138,"Default case should be unreachable!");
          std::logic_error::logic_error(plVar10,(string *)&local_118);
          local_1d1 = 0;
          __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                           (local_c8);
        local_e8 = (SourceLocation)local_40;
        local_e0 = range.startLoc;
        comp_local = (Compilation *)
                     StructuredAssignmentPatternExpression::forStruct
                               (comp,pSVar8,context,(Type *)structScope,(Scope *)elementType,
                                _local_40);
      }
    }
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& Expression::bindAssignmentPattern(Compilation& comp,
                                              const AssignmentPatternExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();

    if (syntax.type) {
        assignmentTarget = &comp.getType(*syntax.type, context);
        if (!assignmentTarget->isSimpleType() && syntax.type->kind != SyntaxKind::TypeReference) {
            if (!assignmentTarget->isError())
                context.addDiag(diag::BadAssignmentPatternType, range) << *assignmentTarget;
            return badExpr(comp, nullptr);
        }
    }

    if (!assignmentTarget || assignmentTarget->isError()) {
        if (!assignmentTarget)
            context.addDiag(diag::AssignmentPatternNoContext, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    const Type& type = *assignmentTarget;
    const Scope* structScope = nullptr;
    const Type* elementType = nullptr;
    bitwidth_t numElements = 0;

    auto& ct = type.getCanonicalType();
    if (ct.kind == SymbolKind::PackedStructType) {
        structScope = &ct.as<PackedStructType>();
    }
    else if (ct.kind == SymbolKind::UnpackedStructType) {
        structScope = &ct.as<UnpackedStructType>();
    }
    else if (ct.kind == SymbolKind::PackedArrayType) {
        auto& ua = ct.as<PackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& ua = ct.as<FixedSizeUnpackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::DynamicArrayType ||
             ct.kind == SymbolKind::AssociativeArrayType || ct.kind == SymbolKind::QueueType) {
        elementType = ct.getArrayElementType();
    }
    else if (ct.isIntegral() && ct.kind != SymbolKind::ScalarType) {
        elementType = ct.isFourState() ? &comp.getLogicType() : &comp.getBitType();
        numElements = ct.getBitWidth();
    }
    else {
        context.addDiag(diag::BadAssignmentPatternType, range) << type;
        return badExpr(comp, nullptr);
    }

    const AssignmentPatternSyntax& p = *syntax.pattern;
    if (structScope) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forStruct(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forStruct(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forStruct(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::DynamicArrayType || ct.kind == SymbolKind::QueueType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
            case SyntaxKind::ReplicatedAssignmentPattern:
                context.addDiag(diag::AssignmentPatternAssociativeType, range);
                return badExpr(comp, nullptr);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forAssociativeArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forFixedArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forFixedArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forFixedArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
}